

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  ImVec4 *pIVar3;
  undefined8 *in_RSI;
  int in_EDI;
  ImGuiColorMod backup;
  ImGuiContext *g;
  ImGuiColorMod *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  pIVar2 = GImGui;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)0x1df953);
  ImVector<ImGuiColorMod>::push_back
            ((ImVector<ImGuiColorMod> *)CONCAT44(in_EDI,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  if (pIVar2->DebugFlashStyleColorIdx != in_EDI) {
    pIVar3 = (pIVar2->Style).Colors + in_EDI;
    uVar1 = *in_RSI;
    pIVar3->x = (float)(int)uVar1;
    pIVar3->y = (float)(int)((ulong)uVar1 >> 0x20);
    uVar1 = in_RSI[1];
    pIVar3->z = (float)(int)uVar1;
    pIVar3->w = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    if (g.DebugFlashStyleColorIdx != idx)
        g.Style.Colors[idx] = col;
}